

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

ElementsDecodeIssuanceStruct * __thiscall
cfd::api::json::ElementsDecodeIssuance::ConvertToStruct
          (ElementsDecodeIssuanceStruct *__return_storage_ptr__,ElementsDecodeIssuance *this)

{
  ElementsDecodeIssuanceStruct::ElementsDecodeIssuanceStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset_entropy);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->contract_hash);
  __return_storage_ptr__->isreissuance = this->isreissuance_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->token);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset);
  __return_storage_ptr__->assetamount = this->assetamount_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->assetamountcommitment);
  __return_storage_ptr__->tokenamount = this->tokenamount_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tokenamountcommitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset_rangeproof);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->token_rangeproof);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeIssuanceStruct ElementsDecodeIssuance::ConvertToStruct() const {  // NOLINT
  ElementsDecodeIssuanceStruct result;
  result.asset_blinding_nonce = asset_blinding_nonce_;
  result.asset_entropy = asset_entropy_;
  result.contract_hash = contract_hash_;
  result.isreissuance = isreissuance_;
  result.token = token_;
  result.asset = asset_;
  result.assetamount = assetamount_;
  result.assetamountcommitment = assetamountcommitment_;
  result.tokenamount = tokenamount_;
  result.tokenamountcommitment = tokenamountcommitment_;
  result.asset_rangeproof = asset_rangeproof_;
  result.token_rangeproof = token_rangeproof_;
  result.ignore_items = ignore_items;
  return result;
}